

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O3

void __thiscall Company::changeBoss(Company *this)

{
  int iVar1;
  Boss *this_00;
  long lVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = Employee::efficiency(&this->boss->super_Employee);
  if (dVar3 < 40.0) {
    this_00 = (Boss *)maxEfficiency(this);
    iVar1 = Boss::getNumberOfEmployees(this->boss);
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        dVar3 = Employee::efficiency(this->employees[lVar2]);
        dVar4 = Employee::efficiency((Employee *)this_00);
        if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
          iVar1 = Boss::getNumberOfEmployees(this->boss);
          this->employees[lVar2] = &this->boss->super_Employee;
          this->boss = this_00;
          Boss::setNumberOfEmployees(this_00,iVar1);
          return;
        }
        lVar2 = lVar2 + 1;
        iVar1 = Boss::getNumberOfEmployees(this->boss);
      } while (lVar2 < iVar1);
    }
  }
  return;
}

Assistant:

void Company::changeBoss() {
    if (boss->efficiency() < 40) {
        Employee *maxEmp = maxEfficiency();
        for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
            if (employees[i]->efficiency() ==  maxEmp->efficiency()) {
                int number = boss->getNumberOfEmployees();
                employees[i] = boss;
                boss = static_cast<Boss *>(maxEmp);
                boss->setNumberOfEmployees(number);
                break;
            }
        }
    }
}